

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O1

chunk_conflict * mtn_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  int A;
  loc grid;
  int A_00;
  short sVar1;
  char *pcVar2;
  _Bool _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  int y;
  int x;
  wchar_t wVar6;
  chunk *c;
  feature *pfVar7;
  loc_conflict lVar8;
  loc_conflict grid2;
  char **ppcVar9;
  long lVar10;
  loc_conflict lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  wchar_t wVar15;
  wchar_t wVar16;
  long lVar17;
  bool bVar18;
  uint local_1ac;
  ulong local_1a8;
  int local_17c;
  wchar_t form_feats [7];
  loc_conflict stairs [3];
  loc_conflict pathpoints [20];
  wchar_t randpoints [20];
  
  wVar16 = (wchar_t)p->place;
  sVar1 = p->last_place;
  form_feats[0] = FEAT_PASS_RUBBLE;
  form_feats[1] = FEAT_RUBBLE;
  form_feats[2] = FEAT_GRASS;
  form_feats[3] = FEAT_TREE;
  form_feats[4] = FEAT_TREE2;
  form_feats[5] = FEAT_ROAD;
  form_feats[6] = FEAT_NONE;
  ppcVar9 = p_error;
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  wVar15 = (wchar_t)ppcVar9;
  c->depth = (int)p->depth;
  c->place = wVar16;
  if (L'\0' < c->height) {
    lVar10 = 0;
    lVar17 = 0;
    do {
      if (L'\0' < c->width) {
        lVar13 = 0;
        do {
          square_set_feat((chunk_conflict *)c,(loc)(lVar10 + lVar13),FEAT_GRASS);
          lVar13 = lVar13 + 1;
        } while (lVar13 < c->width);
      }
      lVar17 = lVar17 + 1;
      wVar15 = L'\0';
      lVar10 = lVar10 + 0x100000000;
    } while (lVar17 < c->height);
  }
  set_num_vaults((chunk_conflict *)c);
  make_edges((chunk_conflict *)c,false,false);
  alloc_paths((chunk_conflict *)c,(player *)(ulong)(uint)wVar16,(int)sVar1,wVar15);
  if (L'\0' < c->height) {
    lVar17 = 0;
    lVar10 = 0;
    do {
      if (L'\0' < c->width) {
        lVar13 = 0;
        do {
          pfVar7 = square_feat((chunk_conflict *)c,(loc)(lVar13 + lVar17));
          if (pfVar7->fidx == FEAT_GRASS) {
            square_set_feat((chunk_conflict *)c,(loc)(lVar13 + lVar17),FEAT_GRANITE);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < c->width);
      }
      lVar10 = lVar10 + 1;
      lVar17 = lVar17 + 0x100000000;
    } while (lVar10 < c->height);
  }
  pcVar2 = world->levels[wVar16].down;
  if (pcVar2 != (char *)0x0) {
    iVar14 = 3;
    do {
      uVar4 = Rand_div(c->height + L'\xfffffffe');
      uVar5 = Rand_div(c->width + L'\xfffffffe');
      grid.y = uVar4 + L'\x01';
      grid.x = uVar5 + L'\x01';
      pfVar7 = square_feat((chunk_conflict *)c,grid);
      if ((pfVar7->fidx == FEAT_ROAD) ||
         (pfVar7 = square_feat((chunk_conflict *)c,grid), pfVar7->fidx == FEAT_GRASS)) {
        square_set_feat((chunk_conflict *)c,grid,FEAT_MORE);
        square_mark((chunk_conflict *)c,grid);
        stairs[3 - iVar14].x = uVar5 + L'\x01';
        stairs[3 - iVar14].y = uVar4 + L'\x01';
        iVar14 = iVar14 + -1;
        if (iVar14 == 0) {
          wVar15 = level_topography((int)sVar1);
          iVar14 = 0;
          if (wVar15 == L'\a') {
            player_place((chunk_conflict2 *)c,p,(loc_conflict)grid);
            iVar14 = 0;
          }
        }
      }
    } while (iVar14 != 0);
  }
  if (c->height < L'\x01') {
    wVar15 = L'\0';
  }
  else {
    lVar17 = 0;
    lVar10 = 0;
    wVar15 = L'\0';
    do {
      if (L'\0' < c->width) {
        lVar13 = 0;
        do {
          pfVar7 = square_feat((chunk_conflict *)c,(loc)(lVar17 + lVar13));
          if (pfVar7->fidx == FEAT_ROAD) {
            square_mark((chunk_conflict *)c,(loc)(lVar17 + lVar13));
            wVar15 = wVar15 + L'\x01';
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < c->width);
      }
      lVar10 = lVar10 + 1;
      lVar17 = lVar17 + 0x100000000;
    } while (lVar10 < c->height);
  }
  local_1ac = height / 2;
  local_1a8 = (ulong)(uint)(width / 2);
  lVar10 = 0;
  do {
    wVar16 = Rand_div(wVar15);
    randpoints[lVar10] = wVar16;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x14);
  if (L'\0' < c->height) {
    lVar10 = 0;
    do {
      if (L'\0' < c->width) {
        uVar12 = 0;
        do {
          pfVar7 = square_feat((chunk_conflict *)c,(loc)(lVar10 << 0x20 | uVar12));
          if (pfVar7->fidx == FEAT_ROAD) {
            wVar15 = wVar15 + L'\xffffffff';
            lVar17 = 0;
            do {
              if (wVar15 == randpoints[lVar17]) {
                pathpoints[lVar17].x = (int)uVar12;
                pathpoints[lVar17].y = (int)lVar10;
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 != 0x14);
          }
          uVar12 = uVar12 + 1;
        } while ((long)uVar12 < (long)c->width);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < c->height);
  }
  if (pcVar2 != (char *)0x0) {
    lVar10 = 0;
    do {
      wVar15 = c->height + c->width;
      lVar11.y = stairs[lVar10].y;
      lVar11.x = stairs[lVar10].x;
      lVar17 = 0;
      do {
        wVar16 = distance(lVar11,pathpoints[lVar17]);
        if (wVar16 < wVar15) {
          local_1ac = pathpoints[lVar17].x;
          local_1a8 = (ulong)(uint)pathpoints[lVar17].y;
          wVar15 = wVar16;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x14);
      mtn_connect((chunk_conflict *)c,lVar11,(loc_conflict)((ulong)local_1ac | local_1a8 << 0x20));
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
  }
  local_17c = rand_range(2,4);
  iVar14 = 0;
  do {
    uVar4 = Rand_div(6);
    A_00 = uVar4 + 4;
    uVar5 = Rand_div(5);
    A = uVar5 + 4;
    y = rand_range(A,(c->height - uVar5) + -5);
    x = rand_range(A_00,(c->width - uVar4) + -5);
    lVar11 = loc(x,y);
    lVar8 = loc(-4 - uVar4,-4 - uVar5);
    lVar11 = loc_sum(lVar11,lVar8);
    lVar8 = loc(x,y);
    grid2 = loc(A_00,A);
    lVar8 = loc_sum(lVar8,grid2);
    _Var3 = check_clearing_space((chunk_conflict *)c,lVar11,lVar8);
    if (_Var3) {
      bVar18 = false;
      _Var3 = generate_starburst_room(c,y - A,x - A_00,A + y,A_00 + x,false,FEAT_GRASS,true);
      if (_Var3) {
        lVar11 = loc(x,y);
        wVar15 = c->height + c->width;
        lVar10 = 0;
        uVar12 = (ulong)local_1ac;
        do {
          wVar16 = distance(lVar11,pathpoints[lVar10]);
          if (wVar16 < wVar15) {
            uVar12 = (ulong)(uint)pathpoints[lVar10].x;
            local_1a8 = (ulong)(uint)pathpoints[lVar10].y;
            wVar15 = wVar16;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x14);
        local_1ac = (uint)uVar12;
        mtn_connect((chunk_conflict *)c,lVar11,(loc_conflict)(uVar12 | local_1a8 << 0x20));
        local_17c = local_17c + -1;
        bVar18 = local_17c == 0;
      }
    }
    else {
      bVar18 = false;
    }
  } while ((!bVar18) && (iVar14 = iVar14 + 1, iVar14 != 0x32));
  if (L'\0' < c->depth) {
    iVar14 = 0;
    do {
      uVar4 = Rand_div(c->height + L'\xfffffffe');
      uVar5 = Rand_div(c->width + L'\xfffffffe');
      lVar8.x = uVar5 + 1;
      lVar8.y = uVar4 + 1;
      wVar16 = make_formation((chunk_conflict *)c,p,lVar8,FEAT_GRANITE,FEAT_GRANITE,form_feats,
                              "Mountain",c->depth * 2);
      wVar15 = c->height + c->width;
      lVar10 = 0;
      do {
        wVar6 = distance(lVar8,pathpoints[lVar10]);
        if (wVar6 < wVar15) {
          local_1ac = pathpoints[lVar10].x;
          local_1a8 = (ulong)(uint)pathpoints[lVar10].y;
          wVar15 = wVar6;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x14);
      iVar14 = iVar14 + wVar16;
      mtn_connect((chunk_conflict *)c,lVar8,(loc_conflict)((ulong)local_1ac | local_1a8 << 0x20));
    } while (SBORROW4(iVar14,c->depth * 0x32) != iVar14 + c->depth * -0x32 < 0);
  }
  if (L'\0' < c->height) {
    lVar10 = 0;
    lVar17 = 0;
    do {
      if (L'\0' < c->width) {
        lVar13 = 0;
        do {
          square_unmark((chunk_conflict *)c,(loc)(lVar10 + lVar13));
          lVar13 = lVar13 + 1;
        } while (lVar13 < c->width);
      }
      lVar17 = lVar17 + 1;
      lVar10 = lVar10 + 0x100000000;
    } while (lVar17 < c->height);
  }
  ensure_connectedness(c,false);
  populate((chunk_conflict *)c,false);
  _Var3 = verify_level((chunk_conflict *)c);
  if (!_Var3) {
    wipe_mon_list(c,p);
    cave_free((chunk_conflict *)c);
    *p_error = "wilderness level had generation issues";
    c = (chunk *)0x0;
  }
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *mtn_gen(struct player *p, int height, int width,
					  const char **p_error)
{
	struct loc grid;
	int i, j;
	int plats;
	int place = p->place;
	int last_place = p->last_place;
	int form_grids = 0;
	int min, dist, floors = 0;
	int randpoints[20];
	struct loc pathpoints[20];
	struct loc nearest_point = { height / 2, width / 2 };
	struct loc stairs[3];

	int form_feats[] = { FEAT_PASS_RUBBLE, FEAT_RUBBLE, FEAT_GRASS,
						 FEAT_TREE, FEAT_TREE2, FEAT_ROAD, FEAT_NONE };

	bool amon_rudh = false;

	/* Make the level */
	struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = place;

	/* Start with grass (lets paths work -NRM-) */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create grass */
			square_set_feat(c, grid, FEAT_GRASS);
		}
	}

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, false, false);

	/* Place 2 or 3 paths to neighbouring places, make the paths through the
	 * place, place the player -NRM- */
	alloc_paths(c, p, place, last_place);

	/* Turn grass to granite */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_GRASS) {
				square_set_feat(c, grid, FEAT_GRANITE);
			}
		}
	}

	/* Dungeon entrance */
	if (world->levels[place].down) {
		/* Set the flag */
		amon_rudh = true;

		/* Mim's cave on Amon Rudh */
		i = 3;
		while (i) {
			grid.y = randint0(c->height - 2) + 1;
			grid.x = randint0(c->width - 2) + 1;
			if ((square_feat(c, grid)->fidx == FEAT_ROAD) ||
				(square_feat(c, grid)->fidx == FEAT_GRASS)) {
				square_set_feat(c, grid, FEAT_MORE);
				square_mark(c, grid);
				i--;
				stairs[2 - i] = grid;
				if (!i && (level_topography(last_place) == TOP_CAVE))
					player_place(c, p, grid);
			}
		}
	}


	/* Make paths permanent */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_ROAD) {
				/* Hack - prepare for plateaux, connecting */
				square_mark(c, grid);
				floors++;
			}
		}
	}

	/* Pick some joining points */
	for (j = 0; j < 20; j++)
		randpoints[j] = randint0(floors);
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_ROAD)
				floors--;
			else
				continue;
			for (j = 0; j < 20; j++) {
				if (floors == randpoints[j]) {
					pathpoints[j] = grid;
				}
			}
		}
	}

	/* Find the staircases, if any */
	if (amon_rudh) {
		for (j = 0; j < 3; j++) {
			grid = stairs[j];

			/* Now join them up */
			min = c->width + c->height;
			for (i = 0; i < 20; i++) {
				dist = distance(grid, pathpoints[i]);
				if (dist < min) {
					min = dist;
					nearest_point = pathpoints[i];
				}
			}
			mtn_connect(c, grid, nearest_point);
		}
	}

	/* Make a few "plateaux" */
	plats = rand_range(2, 4);

	/* Try fairly hard */
	for (j = 0; j < 50; j++) {
		int a, b, x, y;

		/* Try for a plateau */
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		y = rand_range(b, c->height - 1 - b);
		x = rand_range(a, c->width - 1 - a);
		if (!check_clearing_space(c, loc_sum(loc(x, y), loc(-a, -b)),
				loc_sum(loc(x, y), loc(a, b)))
				|| !generate_starburst_room(c, y - b, x - a,
				y + b, x + a, false, FEAT_GRASS, true)) continue;

		/* Success */
		grid = loc(x, y);
		plats--;

		/* Now join it up */
		min = c->width + c->height;
		for (i = 0; i < 20; i++) {
			dist = distance(grid, pathpoints[i]);
			if (dist < min) {
				min = dist;
				nearest_point = pathpoints[i];
			}
		}
		mtn_connect(c, grid, nearest_point);

		/* Done ? */
		if (!plats)
			break;
	}

	/* Make a few formations */
	while (form_grids < 50 * (c->depth)) {
		/* Choose a place */
		grid.y = randint1(c->height - 2);
		grid.x = randint1(c->width - 2);
		form_grids += make_formation(c, p, grid, FEAT_GRANITE, FEAT_GRANITE,
									 form_feats, "Mountain", c->depth * 2);
		/* Now join it up */
		min = c->width + c->height;
		for (i = 0; i < 20; i++) {
			dist = distance(grid, pathpoints[i]);
			if (dist < min) {
				min = dist;
				nearest_point = pathpoints[i];
			}
		}
		mtn_connect(c, grid, nearest_point);

	}

	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);
		}
	}
	ensure_connectedness(c, false);

	/* Place objects, traps and monsters */
	(void) populate(c, false);

	if (!verify_level(c)) {
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "wilderness level had generation issues";
		return NULL;
	}

	return c;
}